

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.h
# Opt level: O2

void __thiscall UnifiedRegex::CountDomain::Mult(CountDomain *this,CountDomain *other)

{
  uint uVar1;
  uint uVar2;
  CharCountOrFlag CVar3;
  CharCount CVar4;
  
  uVar1 = this->lower;
  if (uVar1 != 0) {
    CVar4 = uVar1 * other->lower;
    if ((uint)(0x7ffffffe / (ulong)uVar1) < other->lower) {
      CVar4 = 0x7ffffffe;
    }
    this->lower = CVar4;
  }
  uVar1 = this->upper;
  if (1 < uVar1 + 1) {
    uVar2 = other->upper;
    if (uVar2 == 0xffffffff) {
      CVar3 = 0xffffffff;
    }
    else {
      CVar3 = 0xffffffff;
      if (uVar2 <= (uint)(0x7ffffffe / (ulong)uVar1)) {
        CVar3 = uVar1 * uVar2;
      }
    }
    this->upper = CVar3;
  }
  return;
}

Assistant:

inline void Mult(const CountDomain& other)
        {
            if (lower != 0)
            {
                CharCount maxOther = MaxCharCount / lower;
                if (other.lower > maxOther)
                    // Clip to maximum
                    lower = MaxCharCount;
                else
                    lower *= other.lower;
            }
            if (upper != 0 && upper != CharCountFlag)
            {
                if (other.upper == CharCountFlag)
                    upper = CharCountFlag;
                else
                {
                    CharCount maxOther = MaxCharCount / upper;
                    if (other.upper > maxOther)
                        // Clip to 'unbounded'
                        upper = CharCountFlag;
                    else
                        upper *= other.upper;
                }
            }
        }